

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_unittest.cc
# Opt level: O0

void __thiscall
bssl::PEMTokenizerTest_CarriageReturnLineFeeds_Test::~PEMTokenizerTest_CarriageReturnLineFeeds_Test
          (PEMTokenizerTest_CarriageReturnLineFeeds_Test *this)

{
  PEMTokenizerTest_CarriageReturnLineFeeds_Test *this_local;
  
  ~PEMTokenizerTest_CarriageReturnLineFeeds_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PEMTokenizerTest, CarriageReturnLineFeeds) {
  const char data[] =
      "-----BEGIN EXPECTED-BLOCK-----\r\n"
      "TWF0Y2hlc0FjY2VwdGVkQmxvY2tUeXBl\r\n"
      "-----END EXPECTED-BLOCK-----\r\n";
  std::string_view string_piece(data);
  std::vector<std::string> accepted_types;
  accepted_types.push_back("EXPECTED-BLOCK");

  PEMTokenizer tokenizer(string_piece, accepted_types);
  EXPECT_TRUE(tokenizer.GetNext());

  EXPECT_EQ("EXPECTED-BLOCK", tokenizer.block_type());
  EXPECT_EQ("MatchesAcceptedBlockType", tokenizer.data());

  EXPECT_FALSE(tokenizer.GetNext());
}